

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.cc
# Opt level: O1

SpatialTransform *
RigidBodyDynamics::jcalc_XJ
          (SpatialTransform *__return_storage_ptr__,Model *model,uint joint_id,VectorNd *q)

{
  double dVar1;
  double dVar2;
  JointType JVar3;
  pointer pJVar4;
  SpatialVector *pSVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ostream *poVar12;
  RBDLError *this;
  double dVar13;
  double dVar14;
  ostringstream errormsg;
  string local_228;
  SpatialTransform local_208 [4];
  undefined1 local_88 [88];
  double local_30;
  
  pJVar4 = (model->mJoints).
           super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           .
           super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pJVar4[joint_id].mDoFCount == 1) {
    pJVar4 = pJVar4 + joint_id;
    JVar3 = pJVar4->mJointType;
    if (JVar3 == JointTypeHelical) {
      dVar1 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [pJVar4->q_index];
      pSVar5 = pJVar4->mJointAxes;
      dVar2 = *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 0x10);
      dVar8 = *(double *)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1>;
      dVar9 = *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 8);
      dVar10 = *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 8);
      dVar11 = *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 0x10);
      dVar7 = sin(dVar1);
      local_208[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[4] = cos(dVar1);
      dVar1 = 1.0 - local_208[0].E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[4];
      local_208[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           dVar8 * dVar8 * dVar1 +
           local_208[0].E.super_Matrix3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4];
      local_208[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[1] = dVar8 * dVar9 * dVar1 + -dVar2 * dVar7;
      local_208[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[8] =
           dVar2 * dVar2 * dVar1 +
           local_208[0].E.super_Matrix3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4];
      dVar14 = dVar9 * dVar11;
      local_208[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[2] = dVar2 * dVar8 * dVar1 + dVar10 * dVar7;
      local_208[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[3] = dVar8 * dVar9 * dVar1 + dVar11 * dVar7;
      local_208[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[4] =
           dVar9 * dVar10 * dVar1 +
           local_208[0].E.super_Matrix3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4];
      local_208[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[5] = dVar14 * dVar1 + -dVar8 * dVar7;
      local_208[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[6] = dVar2 * dVar8 * dVar1 + -dVar9 * dVar7;
      local_208[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[7] = dVar14 * dVar1 + dVar8 * dVar7;
      local_208[0].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[0] = 0.0;
      local_208[0].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[1] = 0.0;
      local_208[0].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[2] = 0.0;
      pJVar4 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar5 = pJVar4[joint_id].mJointAxes;
      dVar1 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [pJVar4[joint_id].q_index];
      local_30 = *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 0x28) * dVar1;
      dVar2 = dVar1 * *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 0x20);
      local_88._24_8_ = 0.0;
      local_88._8_8_ = 0.0;
      local_88._16_8_ = 0.0;
      local_88._40_8_ = 0.0;
      local_88._48_8_ = 0.0;
      local_88._56_8_ = 0.0;
      local_88._0_8_ = 1.0;
      local_88._32_8_ = 1.0;
      local_88._64_8_ = 1.0;
      local_88._80_4_ = SUB84(dVar2,0);
      local_88._72_8_ =
           dVar1 * *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 0x18);
      local_88._84_4_ = (int)((ulong)dVar2 >> 0x20);
      Math::SpatialTransform::operator*
                (__return_storage_ptr__,local_208,(SpatialTransform *)local_88);
    }
    else if (JVar3 == JointTypePrismatic) {
      pSVar5 = pJVar4->mJointAxes;
      dVar1 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [pJVar4->q_index];
      dVar2 = *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 0x28);
      dVar8 = *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 0x18);
      dVar7 = dVar1 * *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 0x20);
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
      auVar6._8_4_ = SUB84(dVar7,0);
      auVar6._0_8_ = dVar1 * dVar8;
      auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
      *(undefined1 (*) [16])
       (__return_storage_ptr__->r).super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array = auVar6;
      (__return_storage_ptr__->r).super_Vector3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           dVar2 * dVar1;
    }
    else {
      if (JVar3 != JointTypeRevolute) goto LAB_00178086;
      dVar1 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [pJVar4->q_index];
      pSVar5 = pJVar4->mJointAxes;
      dVar2 = *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 0x10);
      dVar9 = *(double *)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1>;
      dVar10 = *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 8);
      dVar11 = *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 8);
      dVar14 = *(double *)((long)&pSVar5->super_Matrix<double,_6,_1,_0,_6,_1> + 0x10);
      dVar7 = sin(dVar1);
      dVar1 = cos(dVar1);
      dVar8 = 1.0 - dVar1;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           dVar9 * dVar9 * dVar8 + dVar1;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           dVar9 * dVar10 * dVar8 + -dVar2 * dVar7;
      dVar13 = dVar10 * dVar14;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           dVar2 * dVar9 * dVar8 + dVar11 * dVar7;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           dVar9 * dVar10 * dVar8 + dVar14 * dVar7;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           dVar10 * dVar11 * dVar8 + dVar1;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           dVar13 * dVar8 + -dVar9 * dVar7;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           dVar2 * dVar9 * dVar8 + -dVar10 * dVar7;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           dVar13 * dVar8 + dVar9 * dVar7;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           dVar2 * dVar2 * dVar8 + dVar1;
      (__return_storage_ptr__->r).super_Vector3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
      (__return_storage_ptr__->r).super_Vector3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
      (__return_storage_ptr__->r).super_Vector3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
    }
    return __return_storage_ptr__;
  }
LAB_00178086:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_208,"Error: invalid joint type: ",0x1b);
  poVar12 = (ostream *)
            std::ostream::operator<<
                      ((ostream *)local_208,
                       (model->mJoints).
                       super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       ._M_impl.super__Vector_impl_data._M_start[joint_id].mJointType);
  std::endl<char,std::char_traits<char>>(poVar12);
  this = (RBDLError *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  Errors::RBDLError::RBDLError(this,&local_228);
  __cxa_throw(this,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

RBDL_DLLAPI Math::SpatialTransform jcalc_XJ (
    Model &model,
    unsigned int joint_id,
    const Math::VectorNd &q) {
  // exception if we calculate it for the root body
  assert (joint_id > 0);

  if (model.mJoints[joint_id].mDoFCount == 1
      && model.mJoints[joint_id].mJointType != JointTypeCustom) {
    if (model.mJoints[joint_id].mJointType == JointTypeRevolute) {
      return Xrot (q[model.mJoints[joint_id].q_index], Vector3d (
            model.mJoints[joint_id].mJointAxes[0][0],
            model.mJoints[joint_id].mJointAxes[0][1],
            model.mJoints[joint_id].mJointAxes[0][2]
            ));
    } else if (model.mJoints[joint_id].mJointType == JointTypePrismatic) {
      return Xtrans ( Vector3d (
            model.mJoints[joint_id].mJointAxes[0][3]
            * q[model.mJoints[joint_id].q_index],
            model.mJoints[joint_id].mJointAxes[0][4] 
            * q[model.mJoints[joint_id].q_index],
            model.mJoints[joint_id].mJointAxes[0][5] 
            * q[model.mJoints[joint_id].q_index]
            )
          );
    } else if (model.mJoints[joint_id].mJointType == JointTypeHelical) {
      SpatialTransform rot = Xrot(
          q[model.mJoints[joint_id].q_index], Vector3d (
            model.mJoints[joint_id].mJointAxes[0][0],
            model.mJoints[joint_id].mJointAxes[0][1],
            model.mJoints[joint_id].mJointAxes[0][2]
            ));
      SpatialTransform trans = Xtrans ( Vector3d (
            model.mJoints[joint_id].mJointAxes[0][3]
            * q[model.mJoints[joint_id].q_index],
            model.mJoints[joint_id].mJointAxes[0][4] 
            * q[model.mJoints[joint_id].q_index],
            model.mJoints[joint_id].mJointAxes[0][5] 
            * q[model.mJoints[joint_id].q_index]
            )
          );
      return rot * trans;
    }
  }

  std::ostringstream errormsg;
  errormsg << "Error: invalid joint type: " << model.mJoints[joint_id].mJointType << std::endl;
  throw Errors::RBDLError(errormsg.str());

  //never reaches this
  return SpatialTransform();
}